

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_state_mdtm_resp(Curl_easy *data,int ftpcode)

{
  undefined1 *puVar1;
  uchar uVar2;
  FILEPROTO *pFVar3;
  connectdata *pcVar4;
  long intime;
  ulong uVar5;
  ulong uVar6;
  curl_trc_feat *pcVar7;
  CURLcode CVar8;
  int iVar9;
  char *pcVar10;
  size_t sVar11;
  time_t tVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  tm buffer;
  char timebuf [24];
  
  pFVar3 = (data->req).p.file;
  if (ftpcode == 0x226) {
    if ((((data->set).field_0x897 & 0x40) != 0) &&
       ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level)))) {
      pcVar10 = "MDTM failed: file does not exist or permission problem, continuing";
LAB_0012bca1:
      Curl_infof(data,pcVar10);
    }
  }
  else if (ftpcode == 0xd5) {
    pcVar4 = data->conn;
    pcVar10 = Curl_dyn_ptr(&(pcVar4->proto).ftpc.pp.recvbuf);
    sVar11 = strlen(pcVar10 + 4);
    if (((((0xd < sVar11) &&
          (uVar13 = ((int)pcVar10[9] + pcVar10[8] * 10) - 0x210, (int)uVar13 < 0xd)) &&
         (uVar14 = ((int)pcVar10[0xb] + pcVar10[10] * 10) - 0x210, (int)uVar14 < 0x20)) &&
        ((uVar15 = ((int)pcVar10[0xd] + pcVar10[0xc] * 10) - 0x210, (int)uVar15 < 0x18 &&
         (uVar16 = ((int)pcVar10[0xf] + pcVar10[0xe] * 10) - 0x210, (int)uVar16 < 0x3c)))) &&
       (uVar17 = ((int)pcVar10[0x11] + pcVar10[0x10] * 10) - 0x210, (int)uVar17 < 0x3d)) {
      curl_msnprintf(timebuf,0x18,"%04d%02d%02d %02d:%02d:%02d GMT",
                     (ulong)(((int)pcVar10[7] + pcVar10[6] * 10 +
                             ((int)pcVar10[5] + pcVar10[4] * 10) * 100) - 0xd050),(ulong)uVar13,
                     (ulong)uVar14,(ulong)uVar15,(ulong)uVar16,(ulong)uVar17);
      tVar12 = Curl_getdate_capped(timebuf);
      (data->info).filetime = tVar12;
    }
    if (((((data->req).field_0xdb & 2) != 0) && ((pcVar4->proto).ftpc.file != (char *)0x0)) &&
       ((((data->set).field_0x895 & 4) != 0 && (intime = (data->info).filetime, -1 < intime)))) {
      CVar8 = Curl_gmtime(intime,&buffer);
      if (CVar8 != CURLE_OK) {
        return CVar8;
      }
      iVar9 = 6;
      if (buffer.tm_wday != 0) {
        iVar9 = buffer.tm_wday + -1;
      }
      iVar9 = curl_msnprintf(timebuf,0x80,"Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                             Curl_wkday[iVar9],(ulong)(uint)buffer.tm_mday,Curl_month[buffer.tm_mon]
                             ,(ulong)(buffer.tm_year + 0x76c),(ulong)(uint)buffer.tm_hour,
                             (ulong)(uint)buffer.tm_min,(ulong)(uint)buffer.tm_sec);
      CVar8 = client_write_header(data,timebuf,(long)iVar9);
      if (CVar8 != CURLE_OK) {
        return CVar8;
      }
    }
  }
  else if ((((data->set).field_0x897 & 0x40) != 0) &&
          ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level)))
          ) {
    pcVar10 = "unsupported MDTM reply format";
    goto LAB_0012bca1;
  }
  uVar2 = (data->set).timecondition;
  if (uVar2 == '\0') {
LAB_0012be53:
    CVar8 = ftp_state_type(data);
    return CVar8;
  }
  uVar5 = (data->info).filetime;
  if (((long)uVar5 < 1) || (uVar6 = (data->set).timevalue, (long)uVar6 < 1)) {
    if ((((data->set).field_0x897 & 0x40) != 0) &&
       ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level)))) {
      Curl_infof(data,"Skipping time comparison");
    }
    goto LAB_0012be53;
  }
  if (uVar2 == '\x02') {
    if (uVar5 <= uVar6) goto LAB_0012be53;
    if ((((data->set).field_0x897 & 0x40) == 0) ||
       ((pcVar7 = (data->state).feat, pcVar7 != (curl_trc_feat *)0x0 && (pcVar7->log_level < 1))))
    goto LAB_0012be9d;
    pcVar10 = "The requested document is not old enough";
  }
  else {
    if (uVar6 < uVar5) goto LAB_0012be53;
    if ((((data->set).field_0x897 & 0x40) == 0) ||
       ((pcVar7 = (data->state).feat, pcVar7 != (curl_trc_feat *)0x0 && (pcVar7->log_level < 1))))
    goto LAB_0012be9d;
    pcVar10 = "The requested document is not new enough";
  }
  Curl_infof(data,pcVar10);
LAB_0012be9d:
  pFVar3->fd = 2;
  puVar1 = &(data->info).field_0xf4;
  *puVar1 = *puVar1 | 1;
  _ftp_state(data,'\0');
  return CURLE_OK;
}

Assistant:

static CURLcode ftp_state_mdtm_resp(struct Curl_easy *data,
                                    int ftpcode)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = data->req.p.ftp;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  switch(ftpcode) {
  case 213:
    {
      /* we got a time. Format should be: "YYYYMMDDHHMMSS[.sss]" where the
         last .sss part is optional and means fractions of a second */
      int year, month, day, hour, minute, second;
      struct pingpong *pp = &ftpc->pp;
      char *resp = Curl_dyn_ptr(&pp->recvbuf) + 4;
      if(ftp_213_date(resp, &year, &month, &day, &hour, &minute, &second)) {
        /* we have a time, reformat it */
        char timebuf[24];
        msnprintf(timebuf, sizeof(timebuf),
                  "%04d%02d%02d %02d:%02d:%02d GMT",
                  year, month, day, hour, minute, second);
        /* now, convert this into a time() value: */
        data->info.filetime = Curl_getdate_capped(timebuf);
      }

#ifdef CURL_FTP_HTTPSTYLE_HEAD
      /* If we asked for a time of the file and we actually got one as well,
         we "emulate" an HTTP-style header in our output. */

#if defined(__GNUC__) && (defined(__DJGPP__) || defined(__AMIGA__))
#pragma GCC diagnostic push
/* 'time_t' is unsigned in MSDOS and AmigaOS. Silence:
   warning: comparison of unsigned expression in '>= 0' is always true */
#pragma GCC diagnostic ignored "-Wtype-limits"
#endif
      if(data->req.no_body &&
         ftpc->file &&
         data->set.get_filetime &&
         (data->info.filetime >= 0) ) {
#if defined(__GNUC__) && (defined(__DJGPP__) || defined(__AMIGA__))
#pragma GCC diagnostic pop
#endif
        char headerbuf[128];
        int headerbuflen;
        time_t filetime = data->info.filetime;
        struct tm buffer;
        const struct tm *tm = &buffer;

        result = Curl_gmtime(filetime, &buffer);
        if(result)
          return result;

        /* format: "Tue, 15 Nov 1994 12:45:26" */
        headerbuflen =
          msnprintf(headerbuf, sizeof(headerbuf),
                    "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                    Curl_wkday[tm->tm_wday ? tm->tm_wday-1 : 6],
                    tm->tm_mday,
                    Curl_month[tm->tm_mon],
                    tm->tm_year + 1900,
                    tm->tm_hour,
                    tm->tm_min,
                    tm->tm_sec);
        result = client_write_header(data, headerbuf, headerbuflen);
        if(result)
          return result;
      } /* end of a ridiculous amount of conditionals */
#endif
    }
    break;
  default:
    infof(data, "unsupported MDTM reply format");
    break;
  case 550: /* 550 is used for several different problems, e.g.
               "No such file or directory" or "Permission denied".
               It does not mean that the file does not exist at all. */
    infof(data, "MDTM failed: file does not exist or permission problem,"
          " continuing");
    break;
  }

  if(data->set.timecondition) {
    if((data->info.filetime > 0) && (data->set.timevalue > 0)) {
      switch(data->set.timecondition) {
      case CURL_TIMECOND_IFMODSINCE:
      default:
        if(data->info.filetime <= data->set.timevalue) {
          infof(data, "The requested document is not new enough");
          ftp->transfer = PPTRANSFER_NONE; /* mark to not transfer data */
          data->info.timecond = TRUE;
          ftp_state(data, FTP_STOP);
          return CURLE_OK;
        }
        break;
      case CURL_TIMECOND_IFUNMODSINCE:
        if(data->info.filetime > data->set.timevalue) {
          infof(data, "The requested document is not old enough");
          ftp->transfer = PPTRANSFER_NONE; /* mark to not transfer data */
          data->info.timecond = TRUE;
          ftp_state(data, FTP_STOP);
          return CURLE_OK;
        }
        break;
      } /* switch */
    }
    else {
      infof(data, "Skipping time comparison");
    }
  }

  if(!result)
    result = ftp_state_type(data);

  return result;
}